

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  ZSTD_CDict *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  BYTE *pBVar7;
  seqDef *psVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint *puVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  BYTE *pBVar23;
  uint uVar24;
  undefined8 *puVar25;
  undefined8 *puVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  undefined8 local_98;
  uint local_90 [2];
  size_t local_88;
  ulong local_80;
  uint local_78;
  int local_74;
  undefined8 *local_70;
  size_t local_68;
  ZSTD_sequencePosition *local_60;
  uint local_54;
  undefined8 *local_50;
  size_t local_48;
  size_t local_40;
  long local_38;
  
  local_80 = (ulong)seqPos->posInSequence;
  local_38 = (long)src + blockSize;
  pZVar5 = cctx->cdict;
  if (pZVar5 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_40 = 0;
      goto LAB_001bc733;
    }
    pZVar5 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_40 = pZVar5->dictContentSize;
LAB_001bc733:
  uVar14 = seqPos->idx;
  uVar19 = seqPos->posInSequence + (int)blockSize;
  pZVar6 = (cctx->blockState).prevCBlock;
  local_78 = pZVar6->rep[2];
  local_90[0] = local_78;
  local_98 = *(ulong *)pZVar6->rep;
  local_50 = (undefined8 *)(local_38 - 0x20);
  local_74 = 0;
  uVar28 = 0;
  do {
    if (uVar19 == 0) {
      uVar19 = 0;
      goto LAB_001bcbe3;
    }
    uVar12 = (ulong)uVar14;
    if ((inSeqsSize <= uVar12) || (local_74 != 0)) goto LAB_001bcbe3;
    uVar11 = inSeqs[uVar12].offset;
    uVar21 = inSeqs[uVar12].litLength;
    uVar16 = inSeqs[uVar12].matchLength;
    uVar13 = uVar21 + uVar16;
    puVar26 = (undefined8 *)src;
    if (uVar19 < uVar13) {
      iVar20 = 3;
      uVar27 = uVar19 - uVar21;
      if (uVar21 <= uVar19 && uVar27 != 0) {
        uVar10 = uVar21 - (uint)local_80;
        if (uVar21 < (uint)local_80) {
          uVar10 = 0;
        }
        if (blockSize < uVar16) {
          uVar24 = uVar19 - ((uint)local_80 + uVar10);
          uVar4 = (cctx->appliedParams).cParams.minMatch;
          if (uVar24 < uVar4) goto LAB_001bc80f;
          uVar13 = uVar13 - uVar19;
          iVar20 = 0;
          uVar16 = uVar4 - uVar13;
          uVar21 = uVar16;
          if (uVar4 < uVar13) {
            uVar21 = 0;
          }
          uVar27 = uVar28;
          if (uVar4 >= uVar13 && uVar16 != 0) {
            uVar27 = uVar16;
          }
          uVar16 = uVar24 - uVar21;
          uVar19 = uVar19 - uVar21;
          bVar29 = true;
          local_74 = 1;
        }
        else {
LAB_001bc80f:
          bVar29 = false;
          uVar19 = uVar21;
          iVar20 = 3;
        }
        uVar28 = uVar27;
        if (bVar29) goto LAB_001bc848;
      }
    }
    else {
      iVar20 = (uint)local_80 - uVar21;
      if ((uint)local_80 < uVar21) {
        iVar20 = 0;
      }
      uVar16 = uVar16 - iVar20;
      uVar10 = uVar21 - (uint)local_80;
      if (uVar21 < (uint)local_80) {
        uVar10 = 0;
      }
      uVar14 = uVar14 + 1;
      local_80 = 0;
      uVar19 = uVar19 - uVar13;
LAB_001bc848:
      if ((uVar10 == 0) || (iVar20 = 1, (uint)local_98 != uVar11)) {
        if (local_98._4_4_ == uVar11) {
          iVar20 = 2;
        }
        else {
          if (local_78 != uVar11) {
            iVar20 = 0;
            if (uVar10 == 0) {
              iVar20 = (uint)((uint)local_98 - 1 == uVar11) * 3;
            }
            goto LAB_001bc88f;
          }
          iVar20 = 3;
        }
        iVar20 = iVar20 - (uint)(uVar10 == 0);
      }
LAB_001bc88f:
      uVar21 = iVar20 - 1;
      if (iVar20 == 0) {
        uVar21 = uVar11 + 2;
      }
      if (uVar21 < 3) {
        uVar11 = (uVar10 == 0) + uVar21;
        if (uVar11 == 0) {
          uVar12 = local_98 >> 0x20;
          puVar17 = local_90;
        }
        else {
          if (uVar11 == 3) {
            uVar13 = (uint)local_98 - 1;
          }
          else {
            uVar13 = local_90[(ulong)uVar11 - 2];
          }
          puVar17 = local_90 + ((ulong)(uVar11 == 1) - 1);
          uVar12 = local_98 & 0xffffffff;
          local_98 = (ulong)uVar13;
        }
      }
      else {
        uVar12 = local_98 & 0xffffffff;
        puVar17 = (uint *)((long)&local_98 + 4);
        local_98 = (ulong)(uVar21 - 2);
      }
      local_78 = *puVar17;
      local_98 = local_98 & 0xffffffff | uVar12 << 0x20;
      local_90[0] = local_78;
      if ((cctx->appliedParams).validateSequences != 0) {
        uVar18 = (ulong)(uVar10 + uVar16) + seqPos->posInSrc;
        seqPos->posInSrc = uVar18;
        uVar22 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
        uVar12 = local_40 + uVar18;
        if (uVar22 < uVar18) {
          uVar12 = uVar22;
        }
        bVar29 = uVar12 + 2 < (ulong)uVar21;
        bVar30 = uVar16 < (cctx->appliedParams).cParams.minMatch;
        if (bVar30 || bVar29) {
          local_68 = 0xffffffffffffffec;
        }
        iVar20 = 1;
        if (bVar30 || bVar29) goto LAB_001bcbca;
      }
      if ((cctx->seqStore).maxNbSeq < (ulong)(uVar14 - seqPos->idx)) {
        local_68 = 0xffffffffffffffc0;
        iVar20 = 1;
      }
      else {
        uVar12 = (ulong)uVar10;
        puVar26 = (undefined8 *)(uVar12 + (long)src);
        if (local_50 < puVar26) {
          pBVar7 = (cctx->seqStore).lit;
          pBVar23 = pBVar7;
          puVar25 = (undefined8 *)src;
          if (src <= local_50) {
            pBVar23 = pBVar7 + ((long)local_50 - (long)src);
            uVar9 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar7 = *src;
            *(undefined8 *)(pBVar7 + 8) = uVar9;
            puVar25 = local_50;
            if (0x10 < (long)local_50 - (long)src) {
              lVar15 = 0x10;
              do {
                uVar9 = ((undefined8 *)((long)src + lVar15))[1];
                pBVar2 = pBVar7 + lVar15;
                *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar15);
                *(undefined8 *)(pBVar2 + 8) = uVar9;
                puVar3 = (undefined8 *)((long)src + lVar15 + 0x10);
                uVar9 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar9;
                lVar15 = lVar15 + 0x20;
              } while (pBVar2 + 0x20 < pBVar23);
            }
          }
          if (puVar25 < puVar26) {
            lVar15 = 0;
            do {
              pBVar23[lVar15] = *(BYTE *)((long)puVar25 + lVar15);
              lVar15 = lVar15 + 1;
            } while ((long)puVar26 - (long)puVar25 != lVar15);
          }
        }
        else {
          pBVar23 = (cctx->seqStore).lit;
          uVar9 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar23 = *src;
          *(undefined8 *)(pBVar23 + 8) = uVar9;
          if (0x10 < uVar10) {
            pBVar23 = (cctx->seqStore).lit;
            uVar9 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar23 + 0x18) = uVar9;
            if (0x20 < uVar10) {
              lVar15 = 0;
              do {
                puVar26 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar9 = puVar26[1];
                pBVar7 = pBVar23 + lVar15 + 0x20;
                *(undefined8 *)pBVar7 = *puVar26;
                *(undefined8 *)(pBVar7 + 8) = uVar9;
                puVar26 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar9 = puVar26[1];
                *(undefined8 *)(pBVar7 + 0x10) = *puVar26;
                *(undefined8 *)(pBVar7 + 0x18) = uVar9;
                lVar15 = lVar15 + 0x20;
              } while (pBVar7 + 0x20 < pBVar23 + uVar12);
            }
          }
        }
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar12;
        if (0xffff < uVar10) {
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar8 = (cctx->seqStore).sequences;
        psVar8->litLength = (U16)uVar10;
        psVar8->offset = uVar21 + 1;
        if (0xffff < uVar16 - 3) {
          (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar8->matchLength = (U16)(uVar16 - 3);
        (cctx->seqStore).sequences = psVar8 + 1;
        iVar20 = 0;
        puVar26 = (undefined8 *)((long)src + (ulong)(uVar10 + uVar16));
        local_70 = (undefined8 *)src;
        local_54 = uVar14;
      }
    }
LAB_001bcbca:
    src = puVar26;
  } while (iVar20 == 0);
  uVar12 = local_68;
  if (iVar20 == 3) {
LAB_001bcbe3:
    seqPos->idx = uVar14;
    seqPos->posInSequence = uVar19;
    pZVar6 = (cctx->blockState).nextCBlock;
    pZVar6->rep[2] = local_90[0];
    *(ulong *)pZVar6->rep = local_98;
    uVar12 = (ulong)uVar28;
    if ((undefined8 *)src != (undefined8 *)(local_38 - uVar12)) {
      uVar18 = (ulong)(uint)((int)(undefined8 *)(local_38 - uVar12) - (int)src);
      local_88 = inSeqsSize;
      local_60 = seqPos;
      local_48 = blockSize;
      memcpy((cctx->seqStore).lit,src,uVar18);
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar18;
      seqPos->posInSrc = seqPos->posInSrc + uVar18;
    }
  }
  return uVar12;
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                       const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                       const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;
    U32 litLength;
    U32 matchLength;
    U32 rawOffset;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStore: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        litLength = currSeq.litLength;
        matchLength = currSeq.matchLength;
        rawOffset = currSeq.offset;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
            idx++;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 ll0 = (litLength == 0);
            offCode = ZSTD_finalizeOffCode(rawOffset, updatedRepcodes.rep, ll0);
            updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize,
                                                   cctx->appliedParams.cParams.minMatch),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}